

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_get_string_length(coda_type *type,long *length)

{
  ulong uVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (type == (coda_type *)0x0) {
    pcVar3 = "type argument is NULL (%s:%u)";
    uVar2 = 0xb6f;
LAB_0016427e:
    coda_set_error(-100,pcVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,uVar2);
  }
  else {
    switch(type->type_class) {
    case coda_record_class:
      pcVar3 = "record";
      break;
    case coda_array_class:
      pcVar3 = "array";
      break;
    case coda_integer_class:
      pcVar3 = "integer";
      break;
    case coda_real_class:
      pcVar3 = "real";
      break;
    case coda_text_class:
      if (length != (long *)0x0) {
        uVar1 = 0xffffffffffffffff;
        if (-1 < type->bit_size) {
          uVar1 = (ulong)type->bit_size >> 3;
        }
        *length = uVar1;
        return 0;
      }
      pcVar3 = "length argument is NULL (%s:%u)";
      uVar2 = 0xb7a;
      goto LAB_0016427e;
    case coda_raw_class:
      pcVar3 = "raw";
      break;
    case coda_special_class:
      pcVar3 = "special";
      break;
    default:
      pcVar3 = "unknown";
    }
    coda_set_error(-0x69,"type does not refer to text (current type is %s)",pcVar3);
  }
  return -1;
}

Assistant:

LIBCODA_API int coda_type_get_string_length(const coda_type *type, long *length)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->type_class != coda_text_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "type does not refer to text (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }
    if (length == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "length argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *length = (type->bit_size < 0 ? -1 : (long)(type->bit_size >> 3));
    return 0;
}